

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lensshader.cpp
# Opt level: O2

void __thiscall FLensShader::Bind(FLensShader *this)

{
  FShaderProgram *this_00;
  GLint GVar1;
  
  this_00 = &this->mShader;
  if ((this->mShader).mProgram == 0) {
    FShaderProgram::Compile(this_00,Vertex,"shaders/glsl/screenquad.vp",(char *)"",0x14a);
    FShaderProgram::Compile(this_00,Fragment,"shaders/glsl/lensdistortion.fp",(char *)"",0x14a);
    FShaderProgram::SetFragDataLocation(this_00,0,"FragColor");
    FShaderProgram::Link(this_00,"shaders/glsl/lensdistortion");
    FShaderProgram::SetAttribLocation(this_00,0,"PositionInProjection");
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"InputTexture");
    (this->InputTexture).mIndex = GVar1;
    (this->InputTexture).mBuffer = -1;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"Aspect");
    (this->AspectRatio).mIndex = GVar1;
    (this->AspectRatio).mBuffer = 0.0;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"Scale");
    (this->Scale).mIndex = GVar1;
    (this->Scale).mBuffer = 0.0;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"k");
    (this->LensDistortionCoefficient).mIndex = GVar1;
    (this->LensDistortionCoefficient).mBuffer[0] = 0.0;
    (this->LensDistortionCoefficient).mBuffer[1] = 0.0;
    (this->LensDistortionCoefficient).mBuffer[2] = 0.0;
    (this->LensDistortionCoefficient).mBuffer[3] = 0.0;
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"kcube");
    (this->CubicDistortionValue).mIndex = GVar1;
    (this->CubicDistortionValue).mBuffer[0] = 0.0;
    (this->CubicDistortionValue).mBuffer[1] = 0.0;
    (this->CubicDistortionValue).mBuffer[2] = 0.0;
    (this->CubicDistortionValue).mBuffer[3] = 0.0;
  }
  FShaderProgram::Bind(this_00);
  return;
}

Assistant:

void FLensShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/lensdistortion.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/lensdistortion");
		mShader.SetAttribLocation(0, "PositionInProjection");
		InputTexture.Init(mShader, "InputTexture");
		AspectRatio.Init(mShader, "Aspect");
		Scale.Init(mShader, "Scale");
		LensDistortionCoefficient.Init(mShader, "k");
		CubicDistortionValue.Init(mShader, "kcube");
	}
	mShader.Bind();
}